

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::CalcListClipping
               (int items_count,float items_height,int *out_items_display_start,
               int *out_items_display_end)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  int mn;
  int iVar3;
  int local_70;
  int local_6c;
  int end;
  int start;
  ImVec2 pos;
  ImVec2 local_58;
  ImRect local_50;
  undefined1 local_40 [8];
  ImRect unclipped_rect;
  ImGuiWindow *window;
  ImGuiContext *g;
  int *out_items_display_end_local;
  int *out_items_display_start_local;
  float items_height_local;
  int items_count_local;
  
  pIVar1 = GImGui;
  unclipped_rect.Max = (ImVec2)GImGui->CurrentWindow;
  if ((GImGui->LogEnabled & 1U) == 0) {
    bVar2 = GetSkipItemForListClipping();
    if (bVar2) {
      *out_items_display_end = 0;
      *out_items_display_start = 0;
    }
    else {
      local_40 = *(undefined1 (*) [8])((long)unclipped_rect.Max + 0x240);
      unclipped_rect.Min = *(ImVec2 *)((long)unclipped_rect.Max + 0x248);
      if ((pIVar1->NavMoveScoringItems & 1U) != 0) {
        ImRect::Add((ImRect *)local_40,&pIVar1->NavScoringRect);
      }
      if ((pIVar1->NavJustMovedToId != 0) &&
         (*(ImGuiID *)((long)unclipped_rect.Max + 0x3b0) == pIVar1->NavJustMovedToId)) {
        local_58 = operator+((ImVec2 *)((long)unclipped_rect.Max + 0x48),
                             (ImVec2 *)((long)unclipped_rect.Max + 0x3b8));
        pos = operator+((ImVec2 *)((long)unclipped_rect.Max + 0x48),
                        (ImVec2 *)((long)unclipped_rect.Max + 0x3c0));
        ImRect::ImRect(&local_50,&local_58,&pos);
        ImRect::Add((ImRect *)local_40,&local_50);
      }
      start = (int)((ulong)*(undefined8 *)((long)unclipped_rect.Max + 0x110) >> 0x20);
      local_6c = (int)(((float)local_40._4_4_ - (float)start) / items_height);
      local_70 = (int)((unclipped_rect.Min.y - (float)start) / items_height);
      if (((pIVar1->NavMoveScoringItems & 1U) != 0) && (pIVar1->NavMoveClipDir == 2)) {
        local_6c = local_6c + -1;
      }
      if (((pIVar1->NavMoveScoringItems & 1U) != 0) && (pIVar1->NavMoveClipDir == 3)) {
        local_70 = local_70 + 1;
      }
      mn = ImClamp<int>(local_6c,0,items_count);
      iVar3 = ImClamp<int>(local_70 + 1,mn,items_count);
      *out_items_display_start = mn;
      *out_items_display_end = iVar3;
    }
  }
  else {
    *out_items_display_start = 0;
    *out_items_display_end = items_count;
  }
  return;
}

Assistant:

void ImGui::CalcListClipping(int items_count, float items_height, int* out_items_display_start, int* out_items_display_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.LogEnabled)
    {
        // If logging is active, do not perform any clipping
        *out_items_display_start = 0;
        *out_items_display_end = items_count;
        return;
    }
    if (GetSkipItemForListClipping())
    {
        *out_items_display_start = *out_items_display_end = 0;
        return;
    }

    // We create the union of the ClipRect and the scoring rect which at worst should be 1 page away from ClipRect
    ImRect unclipped_rect = window->ClipRect;
    if (g.NavMoveScoringItems)
        unclipped_rect.Add(g.NavScoringRect);
    if (g.NavJustMovedToId && window->NavLastIds[0] == g.NavJustMovedToId)
        unclipped_rect.Add(ImRect(window->Pos + window->NavRectRel[0].Min, window->Pos + window->NavRectRel[0].Max)); // Could store and use NavJustMovedToRectRel

    const ImVec2 pos = window->DC.CursorPos;
    int start = (int)((unclipped_rect.Min.y - pos.y) / items_height);
    int end = (int)((unclipped_rect.Max.y - pos.y) / items_height);

    // When performing a navigation request, ensure we have one item extra in the direction we are moving to
    if (g.NavMoveScoringItems && g.NavMoveClipDir == ImGuiDir_Up)
        start--;
    if (g.NavMoveScoringItems && g.NavMoveClipDir == ImGuiDir_Down)
        end++;

    start = ImClamp(start, 0, items_count);
    end = ImClamp(end + 1, start, items_count);
    *out_items_display_start = start;
    *out_items_display_end = end;
}